

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CURLcode cookie_output(Curl_easy *data,CookieInfo *c,char *filename)

{
  int iVar1;
  void *__base;
  char *pcVar2;
  char *format_ptr;
  Cookie **array;
  size_t nvalid;
  uint i;
  CURLcode error;
  char *tempstore;
  FILE *pFStack_38;
  _Bool use_stdout;
  FILE *out;
  Cookie *co;
  char *filename_local;
  CookieInfo *c_local;
  Curl_easy *data_local;
  
  pFStack_38 = (FILE *)0x0;
  tempstore._7_1_ = 0;
  _i = (char *)0x0;
  if (c == (CookieInfo *)0x0) {
    return CURLE_OK;
  }
  co = (Cookie *)filename;
  filename_local = (char *)c;
  c_local = (CookieInfo *)data;
  remove_expired(c);
  iVar1 = strcmp("-",(char *)co);
  if (iVar1 == 0) {
    pFStack_38 = _stdout;
    tempstore._7_1_ = 1;
LAB_00a1fc79:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,pFStack_38);
    if (*(long *)(filename_local + 0x808) != 0) {
      array = (Cookie **)0x0;
      __base = (*Curl_ccalloc)(1,*(long *)(filename_local + 0x808) << 3);
      if (__base == (void *)0x0) {
        nvalid._4_4_ = CURLE_OUT_OF_MEMORY;
        goto LAB_00a1fe40;
      }
      for (nvalid._0_4_ = 0; (uint)nvalid < 0x100; nvalid._0_4_ = (uint)nvalid + 1) {
        for (out = *(FILE **)(filename_local + (ulong)(uint)nvalid * 8); out != (FILE *)0x0;
            out = *(FILE **)out) {
          if (out->_IO_write_ptr != (char *)0x0) {
            *(FILE **)((long)__base + (long)array * 8) = out;
            array = (Cookie **)((long)array + 1);
          }
        }
      }
      qsort(__base,(size_t)array,8,cookie_sort_ct);
      for (nvalid._0_4_ = 0; (Cookie **)(ulong)(uint)nvalid < array; nvalid._0_4_ = (uint)nvalid + 1
          ) {
        pcVar2 = get_netscape_format(*(Cookie **)((long)__base + (ulong)(uint)nvalid * 8));
        if (pcVar2 == (char *)0x0) {
          (*Curl_cfree)(__base);
          nvalid._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00a1fe40;
        }
        curl_mfprintf((FILE *)pFStack_38,"%s\n",pcVar2);
        (*Curl_cfree)(pcVar2);
      }
      (*Curl_cfree)(__base);
    }
    if ((tempstore._7_1_ & 1) == 0) {
      fclose(pFStack_38);
      pFStack_38 = (FILE *)0x0;
      if ((_i != (char *)0x0) && (iVar1 = Curl_rename(_i,(char *)co), iVar1 != 0)) {
        unlink(_i);
        nvalid._4_4_ = CURLE_WRITE_ERROR;
        goto LAB_00a1fe40;
      }
    }
    (*Curl_cfree)(_i);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    nvalid._4_4_ = Curl_fopen((Curl_easy *)c_local,(char *)co,(FILE **)&stack0xffffffffffffffc8,
                              (char **)&i);
    if (nvalid._4_4_ == CURLE_OK) goto LAB_00a1fc79;
LAB_00a1fe40:
    if ((pFStack_38 != (FILE *)0x0) && ((tempstore._7_1_ & 1) == 0)) {
      fclose(pFStack_38);
    }
    (*Curl_cfree)(_i);
    data_local._4_4_ = nvalid._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cookie_output(struct Curl_easy *data,
                              struct CookieInfo *c, const char *filename)
{
  struct Cookie *co;
  FILE *out = NULL;
  bool use_stdout = FALSE;
  char *tempstore = NULL;
  CURLcode error = CURLE_OK;

  if(!c)
    /* no cookie engine alive */
    return CURLE_OK;

  /* at first, remove expired cookies */
  remove_expired(c);

  if(!strcmp("-", filename)) {
    /* use stdout */
    out = stdout;
    use_stdout = TRUE;
  }
  else {
    error = Curl_fopen(data, filename, &out, &tempstore);
    if(error)
      goto error;
  }

  fputs("# Netscape HTTP Cookie File\n"
        "# https://curl.se/docs/http-cookies.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n\n",
        out);

  if(c->numcookies) {
    unsigned int i;
    size_t nvalid = 0;
    struct Cookie **array;

    array = calloc(1, sizeof(struct Cookie *) * c->numcookies);
    if(!array) {
      error = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    /* only sort the cookies with a domain property */
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      for(co = c->cookies[i]; co; co = co->next) {
        if(!co->domain)
          continue;
        array[nvalid++] = co;
      }
    }

    qsort(array, nvalid, sizeof(struct Cookie *), cookie_sort_ct);

    for(i = 0; i < nvalid; i++) {
      char *format_ptr = get_netscape_format(array[i]);
      if(!format_ptr) {
        free(array);
        error = CURLE_OUT_OF_MEMORY;
        goto error;
      }
      fprintf(out, "%s\n", format_ptr);
      free(format_ptr);
    }

    free(array);
  }

  if(!use_stdout) {
    fclose(out);
    out = NULL;
    if(tempstore && Curl_rename(tempstore, filename)) {
      unlink(tempstore);
      error = CURLE_WRITE_ERROR;
      goto error;
    }
  }

  /*
   * If we reach here we have successfully written a cookie file so theree is
   * no need to inspect the error, any error case should have jumped into the
   * error block below.
   */
  free(tempstore);
  return CURLE_OK;

error:
  if(out && !use_stdout)
    fclose(out);
  free(tempstore);
  return error;
}